

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::write_exponent<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
          (int exp,back_insert_iterator<fmt::v7::detail::buffer<char>_> it)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  
  if (exp + 9999U < 19999) {
    sVar2 = (it.container)->size_;
    uVar3 = sVar2 + 1;
    if (exp < 0) {
      if ((it.container)->capacity_ < uVar3) {
        (**(it.container)->_vptr_buffer)(it.container);
        sVar2 = (it.container)->size_;
        uVar3 = sVar2 + 1;
      }
      (it.container)->size_ = uVar3;
      (it.container)->ptr_[sVar2] = '-';
      exp = -exp;
    }
    else {
      if ((it.container)->capacity_ < uVar3) {
        (**(it.container)->_vptr_buffer)(it.container);
        sVar2 = (it.container)->size_;
        uVar3 = sVar2 + 1;
      }
      (it.container)->size_ = uVar3;
      (it.container)->ptr_[sVar2] = '+';
    }
    if (99 < (uint)exp) {
      uVar4 = (exp & 0xffffU) / 100;
      if (999 < (uint)exp) {
        cVar1 = basic_data<void>::digits[(ulong)uVar4 * 2];
        sVar2 = (it.container)->size_;
        uVar3 = sVar2 + 1;
        if ((it.container)->capacity_ < uVar3) {
          (**(it.container)->_vptr_buffer)(it.container);
          sVar2 = (it.container)->size_;
          uVar3 = sVar2 + 1;
        }
        (it.container)->size_ = uVar3;
        (it.container)->ptr_[sVar2] = cVar1;
      }
      cVar1 = basic_data<void>::digits[(ulong)uVar4 * 2 + 1];
      sVar2 = (it.container)->size_;
      uVar3 = sVar2 + 1;
      if ((it.container)->capacity_ < uVar3) {
        (**(it.container)->_vptr_buffer)(it.container);
        sVar2 = (it.container)->size_;
        uVar3 = sVar2 + 1;
      }
      (it.container)->size_ = uVar3;
      (it.container)->ptr_[sVar2] = cVar1;
      exp = exp + uVar4 * -100 & 0xffff;
    }
    cVar1 = basic_data<void>::digits[(ulong)(uint)exp * 2];
    sVar2 = (it.container)->size_;
    uVar3 = sVar2 + 1;
    if ((it.container)->capacity_ < uVar3) {
      (**(it.container)->_vptr_buffer)(it.container);
      sVar2 = (it.container)->size_;
      uVar3 = sVar2 + 1;
    }
    (it.container)->size_ = uVar3;
    (it.container)->ptr_[sVar2] = cVar1;
    cVar1 = basic_data<void>::digits[(ulong)(uint)exp * 2 + 1];
    sVar2 = (it.container)->size_;
    uVar3 = sVar2 + 1;
    if ((it.container)->capacity_ < uVar3) {
      (**(it.container)->_vptr_buffer)(it.container);
      sVar2 = (it.container)->size_;
      uVar3 = sVar2 + 1;
    }
    (it.container)->size_ = uVar3;
    (it.container)->ptr_[sVar2] = cVar1;
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)it.container;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/format.h"
              ,0x514,"exponent out of range");
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits[exp / 100];
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits[exp];
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}